

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# miniaudio.h
# Opt level: O2

ma_vec3f ma_atomic_vec3f_get(ma_atomic_vec3f *v)

{
  ma_spinlock_lock(&v->lock);
  v->lock = 0;
  return v->v;
}

Assistant:

MA_API ma_vec3f ma_atomic_vec3f_get(ma_atomic_vec3f* v)
{
    ma_vec3f r;

    ma_spinlock_lock(&v->lock);
    {
        r = v->v;
    }
    ma_spinlock_unlock(&v->lock);

    return r;
}